

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squall_klass_table.hpp
# Opt level: O2

bool __thiscall squall::KlassTable::find_klass_object<Foo>(KlassTable *this,HSQOBJECT *obj)

{
  SQObjectType SVar1;
  iterator iVar2;
  SQTable *extraout_RDX;
  shared_ptr<squall::detail::KlassImpBase> p;
  size_t h;
  __shared_ptr<squall::detail::KlassImpBase,_(__gnu_cxx::_Lock_policy)2> local_30;
  size_t local_20;
  
  local_20 = detail::KlassImp<Foo>::hash();
  iVar2 = std::
          _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<squall::detail::KlassImpBase>_>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<squall::detail::KlassImpBase>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<squall::detail::KlassImpBase>_>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<squall::detail::KlassImpBase>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  *)this,&local_20);
  if (iVar2.
      super__Node_iterator_base<std::pair<const_unsigned_long,_std::shared_ptr<squall::detail::KlassImpBase>_>,_false>
      ._M_cur != (__node_type *)0x0) {
    std::__shared_ptr<squall::detail::KlassImpBase,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_30,
               (__shared_ptr<squall::detail::KlassImpBase,_(__gnu_cxx::_Lock_policy)2> *)
               ((long)iVar2.
                      super__Node_iterator_base<std::pair<const_unsigned_long,_std::shared_ptr<squall::detail::KlassImpBase>_>,_false>
                      ._M_cur + 0x10));
    (*(local_30._M_ptr)->_vptr_KlassImpBase[2])();
    SVar1 = (*(local_30._M_ptr)->_vptr_KlassImpBase[3])();
    obj->_type = SVar1;
    (obj->_unVal).pTable = extraout_RDX;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30._M_refcount);
  }
  return iVar2.
         super__Node_iterator_base<std::pair<const_unsigned_long,_std::shared_ptr<squall::detail::KlassImpBase>_>,_false>
         ._M_cur != (__node_type *)0x0;
}

Assistant:

bool find_klass_object(HSQOBJECT& obj) {
        typedef typename std::remove_cv<C>::type CC;
        size_t h = detail::KlassImp<CC>::hash();
        auto i = klasses_.find(h);
        if (i == klasses_.end()) {
            return false;
        } else {
            auto p = (*i).second;
            p->close();
            obj = p->get_klass_object();
            return true;
        }
    }